

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

Optional<llbuild::buildsystem::BuildValue> * __thiscall
llbuild::buildsystem::BuildSystem::build
          (Optional<llbuild::buildsystem::BuildValue> *__return_storage_ptr__,BuildSystem *this,
          BuildKey *key)

{
  BuildSystemImpl *this_00;
  BuildKey BStack_38;
  
  this_00 = (BuildSystemImpl *)this->impl;
  std::__cxx11::string::string((string *)&BStack_38,(string *)key);
  anon_unknown.dwarf_16ac71::BuildSystemImpl::build(__return_storage_ptr__,this_00,&BStack_38);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

llvm::Optional<BuildValue> BuildSystem::build(BuildKey key) {
  return static_cast<BuildSystemImpl*>(impl)->build(key);
}